

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O2

int Ga2_ManMarkup(Gia_Man_t *p,int N,int fSimple)

{
  Vec_Int_t **p_00;
  uint uVar1;
  int iVar2;
  int Entry;
  uint uVar3;
  Vec_Int_t *vLeaves;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  int iVar11;
  
  vLeaves = Vec_IntAlloc(100);
  if (fSimple == 0) {
    for (iVar11 = 0; iVar11 < p->nObjs; iVar11 = iVar11 + 1) {
      pGVar4 = Gia_ManObj(p,iVar11);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar4->Value = 0;
      uVar9 = *(ulong *)pGVar4;
      if ((uVar9 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar9) {
        pGVar4[-(uVar9 & 0x1fffffff)].Value = pGVar4[-(uVar9 & 0x1fffffff)].Value + 1;
        pGVar4[-(ulong)((uint)(uVar9 >> 0x20) & 0x1fffffff)].Value =
             pGVar4[-(ulong)((uint)(uVar9 >> 0x20) & 0x1fffffff)].Value + 1;
        iVar2 = Gia_ObjIsMuxType(pGVar4);
        if (iVar2 != 0) {
          uVar9 = *(ulong *)pGVar4;
          uVar8 = uVar9 & 0x1fffffff;
          uVar5 = *(ulong *)(pGVar4 + -uVar8);
          pGVar4[-uVar8 - (uVar5 & 0x1fffffff)].Value =
               pGVar4[-uVar8 - (uVar5 & 0x1fffffff)].Value + 1;
          pGVar4[-uVar8 - (uVar5 >> 0x20 & 0x1fffffff)].Value =
               pGVar4[-uVar8 - (uVar5 >> 0x20 & 0x1fffffff)].Value + 1;
          uVar5 = uVar9 >> 0x20 & 0x1fffffff;
          uVar9 = *(ulong *)(pGVar4 + -uVar5);
          pGVar4[-uVar5 - (uVar9 & 0x1fffffff)].Value =
               pGVar4[-uVar5 - (uVar9 & 0x1fffffff)].Value + 1;
          pGVar4[-uVar5 - (uVar9 >> 0x20 & 0x1fffffff)].Value =
               pGVar4[-uVar5 - (uVar9 >> 0x20 & 0x1fffffff)].Value + 1;
        }
      }
    }
    for (iVar11 = 0; iVar11 < p->nObjs; iVar11 = iVar11 + 1) {
      pGVar4 = Gia_ManObj(p,iVar11);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar9 = *(ulong *)pGVar4;
      *(ulong *)pGVar4 = uVar9 & 0x7fffffffffffffff;
      uVar5 = uVar9 & 0x1fffffff;
      if (uVar5 == 0x1fffffff || (int)uVar9 < 0) {
        if (-1 < (int)uVar9 || (int)uVar5 == 0x1fffffff) {
          uVar5 = uVar9 | 0x8000000000000000;
          goto LAB_004e437c;
        }
        *(ulong *)(pGVar4 + -uVar5) = *(ulong *)(pGVar4 + -uVar5) | 0x8000000000000000;
      }
      else {
        uVar5 = 0;
        if (1 < pGVar4->Value) {
          uVar5 = 0x8000000000000000;
        }
        uVar5 = uVar5 | uVar9 & 0x7fffffffffffffff;
LAB_004e437c:
        *(ulong *)pGVar4 = uVar5;
      }
    }
    for (iVar11 = 0; iVar11 < p->nObjs; iVar11 = iVar11 + 1) {
      pGVar4 = Gia_ManObj(p,iVar11);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      if ((*(ulong *)pGVar4 & 0x8000000080000000) == 0x8000000000000000 &&
          (~(uint)*(ulong *)pGVar4 & 0x1fffffff) != 0) {
        vLeaves->nSize = 0;
        Ga2_ManCollectLeaves_rec(p,pGVar4,vLeaves,1);
        if (N < vLeaves->nSize) {
          Ga2_ManBreakTree_rec(p,pGVar4,1,N);
        }
      }
    }
  }
  else {
    for (iVar11 = 0; iVar11 < p->nObjs; iVar11 = iVar11 + 1) {
      pGVar4 = Gia_ManObj(p,iVar11);
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar3 = (uint)*(ulong *)pGVar4;
      uVar9 = 0x8000000000000000;
      if ((~uVar3 & 0x1fffffff) != 0) {
        uVar9 = 0;
      }
      if (-1 < (int)uVar3) {
        uVar9 = 0x8000000000000000;
      }
      *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0x7fffffffffffffff | uVar9;
    }
  }
  p_00 = &p->vMapping;
  Vec_IntFreeP(p_00);
  pVVar6 = Vec_IntStart(p->nObjs);
  p->vMapping = pVVar6;
  for (iVar11 = 0; iVar2 = p->nRegs, iVar11 < iVar2; iVar11 = iVar11 + 1) {
    pGVar4 = Gia_ManCi(p,(p->vCis->nSize - iVar2) + iVar11);
    if (pGVar4 == (Gia_Obj_t *)0x0) {
      iVar2 = p->nRegs;
      break;
    }
    pGVar7 = Gia_ObjRoToRi(p,pGVar4);
    if (-1 < *(long *)pGVar4) {
      __assert_fail("pObj->fPhase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x12f,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
    }
    if (-1 < *(long *)(pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff))) {
      __assert_fail("Gia_ObjFanin0(pObjRi)->fPhase",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                    ,0x130,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
    }
    pVVar6 = p->vMapping;
    iVar2 = Gia_ObjId(p,pGVar4);
    Vec_IntWriteEntry(pVVar6,iVar2,p->vMapping->nSize);
    Vec_IntPush(p->vMapping,1);
    pVVar6 = p->vMapping;
    iVar2 = Gia_ObjFaninId0p(p,pGVar7);
    Vec_IntPush(pVVar6,iVar2);
    iVar2 = 0x55555555;
    if ((*(uint *)pGVar7 >> 0x1d & 1) == 0) {
      iVar2 = -0x55555556;
    }
    Vec_IntPush(p->vMapping,iVar2);
    Vec_IntPush(p->vMapping,-1);
  }
  for (iVar11 = 0; iVar11 < p->nObjs; iVar11 = iVar11 + 1) {
    pGVar4 = Gia_ManObj(p,iVar11);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    if ((*(ulong *)pGVar4 & 0x8000000080000000) == 0x8000000000000000 &&
        (~(uint)*(ulong *)pGVar4 & 0x1fffffff) != 0) {
      vLeaves->nSize = 0;
      Ga2_ManCollectLeaves_rec(p,pGVar4,vLeaves,1);
      uVar3 = vLeaves->nSize;
      if (N < (int)uVar3) {
        __assert_fail("Vec_IntSize(vLeaves) <= N",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                      ,0x13f,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
      }
      Vec_IntWriteEntry(*p_00,iVar11,(*p_00)->nSize);
      Vec_IntPush(*p_00,uVar3);
      if ((int)uVar3 < 1) {
        uVar3 = 0;
      }
      puVar10 = Ga2_ManComputeTruth::uTruth5;
      uVar9 = 0;
      while (uVar3 != uVar9) {
        Entry = Vec_IntEntry(vLeaves,(int)uVar9);
        Vec_IntPush(p->vMapping,Entry);
        uVar1 = *puVar10;
        pGVar7 = Gia_ManObj(p,Entry);
        pGVar7->Value = uVar1;
        pGVar7 = Gia_ManObj(p,Entry);
        uVar9 = uVar9 + 1;
        puVar10 = puVar10 + 1;
        if (-1 < *(long *)pGVar7) {
          __assert_fail("Gia_ManObj(p, Leaf)->fPhase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absGla.c"
                        ,0x147,"int Ga2_ManMarkup(Gia_Man_t *, int, int)");
        }
      }
      pVVar6 = p->vMapping;
      uVar3 = Ga2_ObjComputeTruth_rec(p,pGVar4,1);
      Vec_IntPush(pVVar6,uVar3);
      Vec_IntPush(p->vMapping,-1);
      iVar2 = iVar2 + 1;
    }
  }
  Vec_IntFree(vLeaves);
  Gia_ManCleanValue(p);
  return iVar2;
}

Assistant:

int Ga2_ManMarkup( Gia_Man_t * p, int N, int fSimple )
{
    static unsigned uTruth5[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
//    abctime clk = Abc_Clock();
    Vec_Int_t * vLeaves;
    Gia_Obj_t * pObj;
    int i, k, Leaf, CountMarks;

    vLeaves = Vec_IntAlloc( 100 );

    if ( fSimple )
    {
        Gia_ManForEachObj( p, pObj, i )
            pObj->fPhase = !Gia_ObjIsCo(pObj);
    }
    else
    {
        // label nodes with multiple fanouts and inputs MUXes
        Gia_ManForEachObj( p, pObj, i )
        {
            pObj->Value = 0;
            if ( !Gia_ObjIsAnd(pObj) )
                continue;
            Gia_ObjFanin0(pObj)->Value++;
            Gia_ObjFanin1(pObj)->Value++;
            if ( !Gia_ObjIsMuxType(pObj) )
                continue;
            Gia_ObjFanin0(Gia_ObjFanin0(pObj))->Value++;
            Gia_ObjFanin1(Gia_ObjFanin0(pObj))->Value++;
            Gia_ObjFanin0(Gia_ObjFanin1(pObj))->Value++;
            Gia_ObjFanin1(Gia_ObjFanin1(pObj))->Value++;
        }
        Gia_ManForEachObj( p, pObj, i )
        {
            pObj->fPhase = 0;
            if ( Gia_ObjIsAnd(pObj) )
                pObj->fPhase = (pObj->Value > 1);
            else if ( Gia_ObjIsCo(pObj) )
                Gia_ObjFanin0(pObj)->fPhase = 1;
            else 
                pObj->fPhase = 1;
        } 
        // add marks when needed
        Gia_ManForEachAnd( p, pObj, i )
        {
            if ( !pObj->fPhase )
                continue;
            Vec_IntClear( vLeaves );
            Ga2_ManCollectLeaves_rec( p, pObj, vLeaves, 1 );
            if ( Vec_IntSize(vLeaves) > N )
                Ga2_ManBreakTree_rec( p, pObj, 1, N );
        }
    }

    // verify that the tree is split correctly
    Vec_IntFreeP( &p->vMapping );
    p->vMapping = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachRo( p, pObj, i )
    {
        Gia_Obj_t * pObjRi = Gia_ObjRoToRi(p, pObj);
        assert( pObj->fPhase );
        assert( Gia_ObjFanin0(pObjRi)->fPhase );
        // create map
        Vec_IntWriteEntry( p->vMapping, Gia_ObjId(p, pObj), Vec_IntSize(p->vMapping) );
        Vec_IntPush( p->vMapping, 1 );
        Vec_IntPush( p->vMapping, Gia_ObjFaninId0p(p, pObjRi) );
        Vec_IntPush( p->vMapping, Gia_ObjFaninC0(pObjRi) ? 0x55555555 : 0xAAAAAAAA );
        Vec_IntPush( p->vMapping, -1 );  // placeholder for ref counter
    }
    CountMarks = Gia_ManRegNum(p);
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !pObj->fPhase )
            continue;
        Vec_IntClear( vLeaves );
        Ga2_ManCollectLeaves_rec( p, pObj, vLeaves, 1 );
        assert( Vec_IntSize(vLeaves) <= N );
        // create map
        Vec_IntWriteEntry( p->vMapping, i, Vec_IntSize(p->vMapping) );
        Vec_IntPush( p->vMapping, Vec_IntSize(vLeaves) );
        Vec_IntForEachEntry( vLeaves, Leaf, k )
        {            
            Vec_IntPush( p->vMapping, Leaf );
            Gia_ManObj(p, Leaf)->Value = uTruth5[k];
            assert( Gia_ManObj(p, Leaf)->fPhase );
        }
        Vec_IntPush( p->vMapping,  (int)Ga2_ObjComputeTruth_rec( p, pObj, 1 ) );
        Vec_IntPush( p->vMapping, -1 );  // placeholder for ref counter
        CountMarks++;
    }
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_IntFree( vLeaves );
    Gia_ManCleanValue( p );
    return CountMarks;
}